

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O0

Vector3D * CGL::SceneObjects::moller_trumbore(Vector3D *p0,Vector3D *p1,Vector3D *p2,Ray *r)

{
  Vector3D *in_RDI;
  long in_R8;
  double dVar1;
  Vector3D s2;
  Vector3D s1;
  Vector3D s;
  Vector3D e2;
  Vector3D e1;
  Vector3D *t_b1_b2;
  Vector3D *in_stack_fffffffffffffe78;
  Vector3D *u;
  Vector3D local_c8;
  Vector3D local_a8;
  Vector3D local_88;
  Vector3D local_68;
  Vector3D local_48;
  long local_28;
  
  u = in_RDI;
  local_28 = in_R8;
  Vector3D::Vector3D(&local_48);
  Vector3D::Vector3D(&local_68);
  Vector3D::Vector3D(&local_88);
  Vector3D::Vector3D(&local_a8);
  Vector3D::Vector3D(&local_c8);
  Vector3D::operator-(in_RDI,in_stack_fffffffffffffe78);
  Vector3D::operator-(in_RDI,in_stack_fffffffffffffe78);
  Vector3D::operator-(in_RDI,in_stack_fffffffffffffe78);
  cross(u,in_RDI);
  cross(u,in_RDI);
  Vector3D::Vector3D(in_RDI);
  dVar1 = dot(&local_c8,&local_68);
  (in_RDI->field_0).field_0.x = dVar1;
  dVar1 = dot(&local_a8,&local_88);
  (in_RDI->field_0).field_0.y = dVar1;
  dVar1 = dot(&local_c8,(Vector3D *)(local_28 + 0x30));
  (in_RDI->field_0).field_0.z = dVar1;
  dot(&local_a8,&local_48);
  Vector3D::operator/=(in_RDI,(double *)in_stack_fffffffffffffe78);
  return u;
}

Assistant:

Vector3D moller_trumbore(const Vector3D &p0, const Vector3D &p1, const Vector3D &p2, const Ray &r) {
    Vector3D e1, e2, s, s1, s2;

    e1 = p1 - p0;
    e2 = p2 - p0;
    s = r.o - p0;

    s1 = cross(r.d, e2);
    s2 = cross(s, e1);

    Vector3D t_b1_b2 = Vector3D();
    t_b1_b2.x = dot(s2,  e2);
    t_b1_b2.y = dot(s1,   s);
    t_b1_b2.z = dot(s2, r.d);

    t_b1_b2 /= dot(s1, e1);

    return t_b1_b2;
}